

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorRefactor.cpp
# Opt level: O3

HighsInt __thiscall HFactor::rebuild(HFactor *this,HighsTimerClock *factor_timer_clock_pointer)

{
  vector<int,std::allocator<int>> vVar1;
  uint uVar2;
  iterator iVar3;
  pointer piVar4;
  pointer piVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  HighsInt k;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  double *pdVar14;
  int *piVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  iterator iVar19;
  size_type sVar20;
  vector<int,std::allocator<int>> *pvVar21;
  int iVar22;
  long lVar23;
  HighsInt iRow_1;
  HighsInt local_iRow;
  HighsInt local_iRow_2;
  HighsInt iRow;
  HVector column;
  int local_1c4;
  ulong local_1c0;
  double local_1b8;
  int local_1ac;
  vector<double,std::allocator<double>> *local_1a8;
  double local_1a0;
  uint local_194;
  long local_190;
  ulong local_188;
  vector<double,std::allocator<double>> *local_180;
  vector<int,std::allocator<int>> *local_178;
  vector<int,std::allocator<int>> *local_170;
  vector<double,std::allocator<double>> *local_168;
  double local_160;
  vector<int,std::allocator<int>> *local_158;
  vector<int,_std::allocator<int>_> *local_150;
  vector<double,_std::allocator<double>_> *local_148;
  vector<int,std::allocator<int>> *local_140;
  int local_134;
  vector<bool,_std::allocator<bool>_> local_130;
  undefined8 local_108;
  pointer local_100;
  pointer piStack_f8;
  pointer local_f0;
  pointer pdStack_e8;
  pointer local_e0;
  pointer pdStack_d8;
  pointer local_c8;
  pointer pcStack_c0;
  pointer local_b8;
  pointer piStack_b0;
  pointer local_a8;
  pointer piStack_a0;
  pointer local_88;
  pointer piStack_80;
  pointer local_78;
  pointer pdStack_70;
  pointer local_68;
  pointer pdStack_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  luClear(this);
  this->nwork = 0;
  this->basis_matrix_num_el = 0;
  iVar17 = this->num_row;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign(&local_58,(long)iVar17,false);
  this->build_synthetic_tick = (this->refactor_info_).build_synthetic_tick;
  uVar8 = this->num_row;
  uVar9 = (ulong)uVar8;
  if (0 < (int)uVar8) {
    local_178 = (vector<int,std::allocator<int>> *)&this->u_index;
    local_180 = (vector<double,std::allocator<double>> *)&this->u_value;
    local_140 = (vector<int,std::allocator<int>> *)&this->l_index;
    local_168 = (vector<double,std::allocator<double>> *)&this->l_start;
    local_170 = (vector<int,std::allocator<int>> *)&this->u_pivot_index;
    local_1a8 = (vector<double,std::allocator<double>> *)&this->u_pivot_value;
    local_150 = &this->u_start;
    local_148 = &this->l_value;
    pvVar21 = (vector<int,std::allocator<int>> *)0x0;
    local_134 = iVar17;
    do {
      uVar8 = (uint)uVar9;
      local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p._0_4_ =
           (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[(long)pvVar21];
      iVar17 = (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start[(long)pvVar21];
      vVar1 = pvVar21[(long)(this->refactor_info_).pivot_type.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_start];
      if ((byte)vVar1 < 2) {
        this->basis_matrix_num_el = this->basis_matrix_num_el + 1;
        iVar16 = (int)((ulong)((long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        local_108 = (double)CONCAT44(local_108._4_4_,iVar16);
        iVar19._M_current =
             (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_168,iVar19,(int *)&local_108);
        }
        else {
          *iVar19._M_current = iVar16;
          (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar19._M_current + 1;
        }
        iVar19._M_current =
             (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_170,iVar19,(int *)&local_130);
        }
        else {
          *iVar19._M_current =
               (int)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar19._M_current + 1;
        }
        local_108 = 1.0;
        iVar3._M_current =
             (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_1a8,iVar3,(double *)&local_108
                    );
        }
        else {
          *iVar3._M_current = 1.0;
          (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        iVar16 = (int)((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        local_108 = (double)CONCAT44(local_108._4_4_,iVar16);
        iVar19._M_current =
             (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current !=
            (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_003752a4;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (local_150,iVar19,(int *)&local_108);
        goto LAB_003752b1;
      }
      if (((byte)vVar1 & 0xfe) != 2) {
        iVar17 = (int)pvVar21;
        break;
      }
      uVar8 = this->a_start[iVar17];
      uVar2 = this->a_start[(long)iVar17 + 1];
      lVar11 = (long)(int)uVar8;
      local_1c0 = 0xffffffff;
      uVar9 = local_1c0;
      if ((int)uVar8 < (int)uVar2) {
        piVar15 = this->a_index + lVar11;
        uVar18 = uVar8;
        do {
          uVar9 = (ulong)uVar18;
          if (*piVar15 ==
              (int)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) break;
          uVar18 = uVar18 + 1;
          piVar15 = piVar15 + 1;
          uVar9 = local_1c0;
        } while (uVar2 != uVar18);
      }
      local_1c0 = uVar9;
      lVar23 = (long)(int)local_1c0;
      if (ABS(this->a_value[lVar23]) < this->pivot_tolerance) {
        iVar17 = this->nwork + 1;
        goto LAB_00375aa6;
      }
      local_188 = CONCAT44(local_188._4_4_,uVar2);
      local_190 = lVar23;
      if (vVar1 == (vector<int,std::allocator<int>>)0x2) {
        local_160 = 1.0 / this->a_value[lVar23];
        local_1a0 = (double)CONCAT44(local_1a0._4_4_,(int)local_1c0 + 1);
        local_194 = uVar8;
        local_158 = pvVar21;
        bVar7 = true;
        do {
          bVar6 = bVar7;
          uVar8 = local_1a0._0_4_;
          if (bVar6) {
            uVar8 = local_194;
          }
          iVar16 = (int)local_188;
          if (bVar6) {
            iVar16 = (int)local_1c0;
          }
          iVar22 = iVar16 - uVar8;
          if (iVar22 != 0 && (int)uVar8 <= iVar16) {
            lVar23 = (long)(int)uVar8;
            lVar11 = lVar23 * 8;
            do {
              iVar16 = this->a_index[lVar23];
              uVar9 = (ulong)iVar16;
              local_1b8 = (double)CONCAT44(local_1b8._4_4_,iVar16);
              iVar10 = iVar16 + 0x3f;
              if (-1 < (long)uVar9) {
                iVar10 = iVar16;
              }
              if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [(long)(iVar10 >> 6) +
                    ((ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                   (uVar9 & 0x3f) & 1) == 0) {
                iVar19._M_current =
                     (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar19._M_current ==
                    (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_140,iVar19,(int *)&local_1b8);
                }
                else {
                  *iVar19._M_current = iVar16;
                  (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar19._M_current + 1;
                }
                local_108 = this->a_value[lVar23] * local_160;
                iVar3._M_current =
                     (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (local_148,iVar3,(double *)&local_108);
                }
                else {
                  *iVar3._M_current = local_108;
                  (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
              }
              else {
                iVar19._M_current =
                     (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar19._M_current ==
                    (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_178,iVar19,(int *)&local_1b8);
                }
                else {
                  *iVar19._M_current = iVar16;
                  (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar19._M_current + 1;
                }
                pdVar14 = (double *)((long)this->a_value + lVar11);
                iVar3._M_current =
                     (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            (local_180,iVar3,pdVar14);
                }
                else {
                  *iVar3._M_current = *pdVar14;
                  (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
              }
              lVar23 = lVar23 + 1;
              lVar11 = lVar11 + 8;
              iVar22 = iVar22 + -1;
            } while (iVar22 != 0);
          }
          bVar7 = false;
        } while (bVar6);
        iVar16 = (int)((ulong)((long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        local_108 = (double)CONCAT44(local_108._4_4_,iVar16);
        iVar19._M_current =
             (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_168,iVar19,(int *)&local_108);
        }
        else {
          *iVar19._M_current = iVar16;
          (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar19._M_current + 1;
        }
        pvVar21 = local_158;
        lVar11 = local_190;
        iVar19._M_current =
             (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_170,iVar19,(int *)&local_130);
        }
        else {
          *iVar19._M_current =
               (int)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar19._M_current + 1;
        }
        iVar3._M_current =
             (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_1a8,iVar3,this->a_value + lVar11);
        }
        else {
          *iVar3._M_current = this->a_value[lVar11];
          (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        iVar16 = (int)((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        local_108 = (double)CONCAT44(local_108._4_4_,iVar16);
        iVar19._M_current =
             (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_150,iVar19,(int *)&local_108);
        }
        else {
LAB_003752a4:
          *iVar19._M_current = iVar16;
          (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar19._M_current + 1;
        }
      }
      else {
        iVar16 = (int)local_1c0 - uVar8;
        if (iVar16 != 0 && (int)uVar8 <= (int)local_1c0) {
          lVar23 = lVar11 * 4;
          lVar11 = lVar11 << 3;
          do {
            piVar15 = (int *)((long)this->a_index + lVar23);
            iVar19._M_current =
                 (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar19._M_current ==
                (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_178,iVar19,piVar15);
            }
            else {
              *iVar19._M_current = *piVar15;
              (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar19._M_current + 1;
            }
            pdVar14 = (double *)((long)this->a_value + lVar11);
            iVar3._M_current =
                 (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (local_180,iVar3,pdVar14);
            }
            else {
              *iVar3._M_current = *pdVar14;
              (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
            lVar23 = lVar23 + 4;
            lVar11 = lVar11 + 8;
            iVar16 = iVar16 + -1;
          } while (iVar16 != 0);
        }
        iVar16 = (uint)local_1c0 + 1;
        if (iVar16 < (int)local_188) {
          lVar11 = (long)iVar16 * 4;
          lVar23 = (long)iVar16 << 3;
          iVar16 = ~(uint)local_1c0 + (int)local_188;
          do {
            piVar15 = (int *)((long)this->a_index + lVar11);
            iVar19._M_current =
                 (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar19._M_current ==
                (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_178,iVar19,piVar15);
            }
            else {
              *iVar19._M_current = *piVar15;
              (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar19._M_current + 1;
            }
            pdVar14 = (double *)((long)this->a_value + lVar23);
            iVar3._M_current =
                 (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (local_180,iVar3,pdVar14);
            }
            else {
              *iVar3._M_current = *pdVar14;
              (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
            lVar11 = lVar11 + 4;
            lVar23 = lVar23 + 8;
            iVar16 = iVar16 + -1;
          } while (iVar16 != 0);
        }
        iVar16 = (int)((ulong)((long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        local_108 = (double)CONCAT44(local_108._4_4_,iVar16);
        iVar19._M_current =
             (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_168,iVar19,(int *)&local_108);
        }
        else {
          *iVar19._M_current = iVar16;
          (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar19._M_current + 1;
        }
        lVar11 = local_190;
        iVar19._M_current =
             (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_170,iVar19,(int *)&local_130);
        }
        else {
          *iVar19._M_current =
               (int)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar19._M_current + 1;
        }
        iVar3._M_current =
             (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_1a8,iVar3,this->a_value + lVar11);
        }
        else {
          *iVar3._M_current = this->a_value[lVar11];
          (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        iVar16 = (int)((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        local_108 = (double)CONCAT44(local_108._4_4_,iVar16);
        iVar19._M_current =
             (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current !=
            (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_003752a4;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (local_150,iVar19,(int *)&local_108);
      }
LAB_003752b1:
      this->basic_index
      [(int)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p] = iVar17;
      iVar17 = (int)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 0x3f;
      if (-1 < (long)(int)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
        iVar17 = (int)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      }
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p
      [(long)(iVar17 >> 6) +
       ((ulong)(((long)(int)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
                0x800000000000003fU) < 0x8000000000000001) - 1)] =
           local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [(long)(iVar17 >> 6) +
            ((ulong)(((long)(int)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
                     0x800000000000003fU) < 0x8000000000000001) - 1)] |
           1L << ((byte)(int)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 0x3f)
      ;
      pvVar21 = pvVar21 + 1;
      uVar8 = this->num_row;
      uVar9 = (ulong)(int)uVar8;
      iVar17 = local_134;
    } while ((long)pvVar21 < (long)uVar9);
  }
  if (iVar17 < (int)uVar8) {
    std::vector<int,_std::allocator<int>_>::resize(&this->l_start,(long)(int)(uVar8 + 1));
    sVar20 = (size_type)this->num_row;
    if (iVar17 < this->num_row) {
      piVar4 = (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = (long)iVar17;
      iVar16 = piVar4[lVar11];
      do {
        piVar4[lVar11 + 1] = iVar16;
        lVar11 = lVar11 + 1;
        sVar20 = (size_type)this->num_row;
      } while (lVar11 < (long)sVar20);
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->l_pivot_index,sVar20);
    sVar20 = (size_type)this->num_row;
    if (0 < (long)sVar20) {
      piVar4 = (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      piVar5 = (this->l_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = 0;
      do {
        piVar5[lVar11] = piVar4[lVar11];
        lVar11 = lVar11 + 1;
        sVar20 = (size_type)this->num_row;
      } while (lVar11 < (long)sVar20);
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->l_pivot_lookup,sVar20);
    if (0 < this->num_row) {
      piVar4 = (this->l_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->l_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = 0;
      do {
        piVar5[piVar4[lVar11]] = (int)lVar11;
        lVar11 = lVar11 + 1;
      } while (lVar11 < this->num_row);
    }
    std::vector<bool,_std::allocator<bool>_>::vector(&local_130,&local_58);
    local_e0 = (pointer)0x0;
    pdStack_d8 = (pointer)0x0;
    local_f0 = (pointer)0x0;
    pdStack_e8 = (pointer)0x0;
    local_100 = (pointer)0x0;
    piStack_f8 = (pointer)0x0;
    local_c8 = (pointer)0x0;
    pcStack_c0 = (pointer)0x0;
    local_b8 = (pointer)0x0;
    piStack_b0 = (pointer)0x0;
    local_a8 = (pointer)0x0;
    piStack_a0 = (pointer)0x0;
    local_88 = (pointer)0x0;
    piStack_80 = (pointer)0x0;
    local_78 = (pointer)0x0;
    pdStack_70 = (pointer)0x0;
    local_68 = (pointer)0x0;
    pdStack_60 = (pointer)0x0;
    HVectorBase<double>::setup((HVectorBase<double> *)&local_108,this->num_row);
    local_1a8 = (vector<double,std::allocator<double>> *)0x0;
    if (iVar17 < this->num_row) {
      local_178 = (vector<int,std::allocator<int>> *)&this->u_index;
      local_180 = (vector<double,std::allocator<double>> *)&this->u_value;
      local_140 = (vector<int,std::allocator<int>> *)&this->l_index;
      local_148 = &this->l_value;
      local_158 = (vector<int,std::allocator<int>> *)&this->u_pivot_index;
      local_168 = (vector<double,std::allocator<double>> *)&this->u_pivot_value;
      local_170 = (vector<int,std::allocator<int>> *)&this->u_start;
      lVar11 = (long)iVar17;
      local_1a0 = 0.0;
      do {
        local_1c4 = (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar11];
        iVar17 = (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar11];
        HVectorBase<double>::clear((HVectorBase<double> *)&local_108);
        iVar16 = this->a_start[iVar17];
        lVar23 = (long)iVar16;
        iVar22 = this->a_start[(long)iVar17 + 1];
        if (iVar16 < iVar22) {
          do {
            iVar16 = this->a_index[lVar23];
            uVar9 = (ulong)iVar16;
            local_1b8 = (double)CONCAT44(local_1b8._4_4_,iVar16);
            iVar10 = iVar16 + 0x3f;
            if (-1 < (long)uVar9) {
              iVar10 = iVar16;
            }
            if ((*(ulong *)((long)(iVar10 >> 6) * 8 +
                            CONCAT44(local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                     ._4_4_,(int)local_130.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p) + -8 +
                           (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar9 & 0x3f) & 1) == 0) {
              lVar12 = (long)local_108._4_4_;
              local_108 = (double)CONCAT44(local_108._4_4_ + 1,(int)local_108);
              local_100[lVar12] = iVar16;
              pdStack_e8[iVar16] = this->a_value[lVar23];
            }
            else {
              iVar19._M_current =
                   (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar19._M_current ==
                  (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_178,iVar19,(int *)&local_1b8);
              }
              else {
                *iVar19._M_current = iVar16;
                (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar19._M_current + 1;
              }
              iVar3._M_current =
                   (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          (local_180,iVar3,this->a_value + lVar23);
              }
              else {
                *iVar3._M_current = this->a_value[lVar23];
                (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
            }
            lVar23 = lVar23 + 1;
          } while ((int)lVar23 != iVar22);
        }
        ftranL(this,(HVectorBase<double> *)&local_108,local_1a0,(HighsTimerClock *)0x0);
        local_160 = local_1a0 * 0.95;
        local_1a0 = ((double)local_108._4_4_ / (double)this->num_row) * 0.05;
        HVectorBase<double>::tight((HVectorBase<double> *)&local_108);
        local_1c0 = (ulong)local_108._4_4_;
        local_188 = 0xffffffff;
        uVar9 = local_188;
        if (0 < (long)local_1c0) {
          uVar13 = 0;
          do {
            uVar9 = uVar13;
            if (local_100[uVar13] == local_1c4) break;
            uVar13 = uVar13 + 1;
            uVar9 = local_188;
          } while (local_1c0 != uVar13);
        }
        local_188 = uVar9;
        if (ABS(pdStack_e8[local_1c4]) < this->pivot_tolerance) {
          iVar17 = this->num_row - (int)lVar11;
          local_1a8 = (vector<double,std::allocator<double>> *)
                      CONCAT71((int7)(int3)((uint)local_1c4 >> 8),1);
          goto LAB_00375a17;
        }
        local_1a0 = local_1a0 + local_160;
        local_160 = 1.0 / pdStack_e8[local_1c4];
        local_194 = (int)local_188 + 1;
        local_190 = lVar11;
        bVar7 = true;
        do {
          bVar6 = bVar7;
          uVar8 = local_194;
          if (bVar6) {
            uVar8 = 0;
          }
          iVar16 = (int)local_1c0;
          if (bVar6) {
            iVar16 = (int)local_188;
          }
          iVar22 = iVar16 - uVar8;
          if (iVar22 != 0 && (int)uVar8 <= iVar16) {
            lVar11 = (long)(int)uVar8;
            do {
              local_1ac = local_100[lVar11];
              uVar9 = (ulong)local_1ac;
              iVar16 = local_1ac + 0x3f;
              if (-1 < (long)uVar9) {
                iVar16 = local_1ac;
              }
              if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [(long)(iVar16 >> 6) +
                    ((ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                   (uVar9 & 0x3f) & 1) == 0) {
                iVar19._M_current =
                     (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar19._M_current ==
                    (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_140,iVar19,&local_1ac);
                }
                else {
                  *iVar19._M_current = local_1ac;
                  (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar19._M_current + 1;
                }
                local_1b8 = pdStack_e8[local_1ac] * local_160;
                iVar3._M_current =
                     (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (local_148,iVar3,&local_1b8);
                }
                else {
                  *iVar3._M_current = local_1b8;
                  (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
              }
              else {
                iVar19._M_current =
                     (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar19._M_current ==
                    (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_178,iVar19,&local_1ac);
                }
                else {
                  *iVar19._M_current = local_1ac;
                  (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar19._M_current + 1;
                }
                iVar3._M_current =
                     (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            (local_180,iVar3,pdStack_e8 + local_1ac);
                }
                else {
                  *iVar3._M_current = pdStack_e8[local_1ac];
                  (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
              }
              lVar11 = lVar11 + 1;
              iVar22 = iVar22 + -1;
            } while (iVar22 != 0);
          }
          lVar11 = local_190;
          bVar7 = false;
        } while (bVar6);
        (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[local_190 + 1] =
             (int)((ulong)((long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
        iVar19._M_current =
             (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_158,iVar19,&local_1c4);
        }
        else {
          *iVar19._M_current = local_1c4;
          (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar19._M_current + 1;
        }
        iVar3._M_current =
             (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_168,iVar3,pdStack_e8 + local_1c4);
        }
        else {
          *iVar3._M_current = pdStack_e8[local_1c4];
          (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        iVar16 = (int)((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        local_1b8 = (double)CONCAT44(local_1b8._4_4_,iVar16);
        iVar19._M_current =
             (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_170,iVar19,(int *)&local_1b8);
        }
        else {
          *iVar19._M_current = iVar16;
          (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar19._M_current + 1;
        }
        this->basic_index[local_1c4] = iVar17;
        iVar16 = local_1c4 + 0x3f;
        if (-1 < (long)local_1c4) {
          iVar16 = local_1c4;
        }
        local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [(long)(iVar16 >> 6) +
         ((ulong)(((long)local_1c4 & 0x800000000000003fU) < 0x8000000000000001) - 1)] =
             local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [(long)(iVar16 >> 6) +
              ((ulong)(((long)local_1c4 & 0x800000000000003fU) < 0x8000000000000001) - 1)] |
             1L << ((byte)local_1c4 & 0x3f);
        lVar11 = lVar11 + 1;
      } while (lVar11 < this->num_row);
    }
    local_1a8 = (vector<double,std::allocator<double>> *)0x0;
LAB_00375a17:
    if (pdStack_70 != (pointer)0x0) {
      operator_delete(pdStack_70);
    }
    if (local_88 != (pointer)0x0) {
      operator_delete(local_88);
    }
    if (piStack_b0 != (pointer)0x0) {
      operator_delete(piStack_b0);
    }
    if (local_c8 != (pointer)0x0) {
      operator_delete(local_c8);
    }
    if (pdStack_e8 != (pointer)0x0) {
      operator_delete(pdStack_e8);
    }
    if (local_100 != (pointer)0x0) {
      operator_delete(local_100);
    }
    if ((void *)CONCAT44(local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                         (int)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) !=
        (void *)0x0) {
      operator_delete((void *)CONCAT44(local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p._4_4_,
                                       (int)local_130.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p));
    }
    if ((char)local_1a8 != '\0') goto LAB_00375aa6;
  }
  iVar17 = 0;
  buildFinish(this);
LAB_00375aa6:
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return iVar17;
}

Assistant:

HighsInt HFactor::rebuild(HighsTimerClock* factor_timer_clock_pointer) {
  const bool report_lu = false;
  // Check that the refactorization information should be used
  assert(refactor_info_.use);
  /**
   * 0. Clear L and U factor
   */
  luClear();

  nwork = 0;
  basis_matrix_num_el = 0;
  HighsInt stage = num_row;
  HighsInt rank_deficiency = 0;
  vector<bool> has_pivot;
  has_pivot.assign(num_row, false);
  const bool report_unit = false;
  const bool report_singletons = false;
  const bool report_markowitz = false;
  const bool report_anything =
      report_unit || report_singletons || report_markowitz;
  if (report_anything) printf("\nRefactor\n");
  // Take build_synthetic_tick from the refactor info so that this
  // refactorization doesn't look unrealistically cheap.
  this->build_synthetic_tick = this->refactor_info_.build_synthetic_tick;
  // Check that the refactorization info has been set up
  assert((int)this->refactor_info_.pivot_row.size() >= num_row);
  assert((int)this->refactor_info_.pivot_var.size() >= num_row);
  assert((int)this->refactor_info_.pivot_type.size() >= num_row);
  for (HighsInt iK = 0; iK < num_row; iK++) {
    HighsInt iRow = this->refactor_info_.pivot_row[iK];
    HighsInt iVar = this->refactor_info_.pivot_var[iK];
    int8_t pivot_type = this->refactor_info_.pivot_type[iK];
    assert(!has_pivot[iRow]);

    if (pivot_type == kPivotLogical || pivot_type == kPivotUnit) {
      if (pivot_type == kPivotLogical) {
        //
        // 1.1 Logical column
        if (report_unit) printf("Stage %d: Logical\n", (int)iK);
        assert(iVar >= num_col);
        basis_matrix_num_el++;
      } else if (pivot_type == kPivotUnit) {
        //
        // 1.2 (Structural) unit column
        if (report_unit) printf("Stage %d: Unit\n", (int)iK);
        assert(iVar < num_col);
        HighsInt start = a_start[iVar];
        HighsInt count = a_start[iVar + 1] - start;
        assert(a_index[start] == iRow);
        assert(count == 1 && a_value[start] == 1);
        basis_matrix_num_el++;
      }
      // 1.3 Record unit column
      l_start.push_back(l_index.size());
      u_pivot_index.push_back(iRow);
      u_pivot_value.push_back(1);
      u_start.push_back(u_index.size());
    } else if (pivot_type == kPivotRowSingleton ||
               pivot_type == kPivotColSingleton) {
      //
      // Row or column singleton
      assert(iVar < num_col);
      const HighsInt start = a_start[iVar];
      const HighsInt end = a_start[iVar + 1];
      // Find where the pivot is
      HighsInt pivot_k = -1;
      for (HighsInt k = start; k < end; k++) {
        if (a_index[k] == iRow) {
          pivot_k = k;
          break;
        }
      }
      assert(pivot_k >= 0);
      // Check that the pivot isn't too small. Shouldn't happen since
      // this is refactorization
      double abs_pivot = std::fabs(a_value[pivot_k]);
      assert(abs_pivot >= pivot_tolerance);
      if (abs_pivot < pivot_tolerance) {
        rank_deficiency = nwork + 1;
        return rank_deficiency;
      }
      if (pivot_type == kPivotRowSingleton) {
        //
        // 2.2 Deal with row singleton
        const double pivot_multiplier = 1 / a_value[pivot_k];
        if (report_singletons)
          printf("Stage %d: Row singleton (%4d, %g)\n", (int)iK, (int)pivot_k,
                 pivot_multiplier);
        for (HighsInt section = 0; section < 2; section++) {
          HighsInt p0 = section == 0 ? start : pivot_k + 1;
          HighsInt p1 = section == 0 ? pivot_k : end;
          for (HighsInt k = p0; k < p1; k++) {
            HighsInt local_iRow = a_index[k];
            if (!has_pivot[local_iRow]) {
              if (report_singletons)
                printf("Row singleton: L En (%4d, %11.4g)\n", (int)local_iRow,
                       a_value[k] * pivot_multiplier);
              l_index.push_back(local_iRow);
              l_value.push_back(a_value[k] * pivot_multiplier);
            } else {
              if (report_singletons)
                printf("Row singleton: U En (%4d, %11.4g)\n", (int)local_iRow,
                       a_value[k]);
              u_index.push_back(local_iRow);
              u_value.push_back(a_value[k]);
            }
          }
        }
        l_start.push_back(l_index.size());
        if (report_singletons)
          printf("Row singleton: U Pv (%4d, %11.4g)\n", (int)iRow,
                 a_value[pivot_k]);
        u_pivot_index.push_back(iRow);
        u_pivot_value.push_back(a_value[pivot_k]);
        u_start.push_back(u_index.size());
      } else {
        //
        // 2.3 Deal with column singleton
        if (report_singletons) printf("Stage %d: Col singleton\n", (int)iK);
        for (HighsInt k = start; k < pivot_k; k++) {
          if (report_singletons)
            printf("Col singleton: U En (%4d, %11.4g)\n", (int)a_index[k],
                   a_value[k]);
          u_index.push_back(a_index[k]);
          u_value.push_back(a_value[k]);
        }
        for (HighsInt k = pivot_k + 1; k < end; k++) {
          if (report_singletons)
            printf("Col singleton: U En (%4d, %11.4g)\n", (int)a_index[k],
                   a_value[k]);
          u_index.push_back(a_index[k]);
          u_value.push_back(a_value[k]);
        }
        l_start.push_back(l_index.size());
        if (report_singletons)
          printf("Col singleton: U Pv (%4d, %11.4g)\n", (int)iRow,
                 a_value[pivot_k]);
        u_pivot_index.push_back(iRow);
        u_pivot_value.push_back(a_value[pivot_k]);
        u_start.push_back(u_index.size());
      }
    } else {
      assert(pivot_type == kPivotMarkowitz);
      stage = iK;
      break;
    }
    basic_index[iRow] = iVar;
    has_pivot[iRow] = true;
  }
  if (report_lu) {
    printf("\nAfter units and singletons\n");
    reportLu(kReportLuBoth, false);
  }
  if (stage < num_row) {
    // Handle the remaining Markowitz pivots
    //
    // First of all complete the L factor with identity columns so
    // that FtranL counts the RHS entries in rows that don't yet have
    // picots by running to completion. In the hyper-sparse code,
    // these will HOPEFULLY be skipped
    //
    // There are already l_start entries for the first stage rows, but
    // l_pivot_index is not assigned, as u_pivot_index gets copied into it
    l_start.resize(num_row + 1);
    for (HighsInt iK = stage; iK < num_row; iK++) l_start[iK + 1] = l_start[iK];
    l_pivot_index.resize(num_row);
    for (HighsInt iK = 0; iK < num_row; iK++)
      l_pivot_index[iK] = this->refactor_info_.pivot_row[iK];
    // To do hyper-sparse FtranL operations, have to set up l_pivot_lookup.
    l_pivot_lookup.resize(num_row);
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      if (iRow < stage) {
        if (l_pivot_lookup[l_pivot_index[iRow]] != iRow) {
          // printf("Strange: Thought that l_pivot_lookup[l_pivot_index[iRow]]
          // == iRow\n");
        }
      }
      l_pivot_lookup[l_pivot_index[iRow]] = iRow;
    }
    // Need to know whether to consider matrix entries for FtranL
    // operation. Initially these correspond to all the rows without
    // pivots
    vector<bool> not_in_bump = has_pivot;
    // Monitor density of FtranL result to possibly switch from exploiting
    // hyper-sparsity
    double expected_density = 0.0;
    // Initialise a HVector in which the L and U entries of the
    // pivotal column will be formed
    HVector column;
    column.setup(num_row);
    for (HighsInt iK = stage; iK < num_row; iK++) {
      HighsInt iRow = this->refactor_info_.pivot_row[iK];
      HighsInt iVar = this->refactor_info_.pivot_var[iK];
      int8_t pivot_type = this->refactor_info_.pivot_type[iK];
      assert(!has_pivot[iRow]);
      assert(pivot_type == kPivotMarkowitz);
      // Set up the column for the FtranL. It contains the matrix
      // entries in rows without pivots, and the remaining entries
      // start forming the U column
      column.clear();
      HighsInt start = a_start[iVar];
      HighsInt end = a_start[iVar + 1];
      for (HighsInt iEl = start; iEl < end; iEl++) {
        HighsInt local_iRow = a_index[iEl];
        if (not_in_bump[local_iRow]) {
          u_index.push_back(local_iRow);
          u_value.push_back(a_value[iEl]);
        } else {
          column.index[column.count++] = local_iRow;
          column.array[local_iRow] = a_value[iEl];
        }
      }
      // Perform FtranL, but don't time it!
      ftranL(column, expected_density);
      // Update the running average density
      double local_density = (1.0 * column.count) / num_row;
      expected_density = kRunningAverageMultiplier * local_density +
                         (1 - kRunningAverageMultiplier) * expected_density;
      // Strip out small values
      column.tight();
      // Now form the column of L
      //
      // Find the pivot
      HighsInt pivot_k = -1;
      start = 0;
      end = column.count;
      for (HighsInt k = start; k < end; k++) {
        if (column.index[k] == iRow) {
          pivot_k = k;
          break;
        }
      }
      assert(pivot_k >= 0);
      // Check that the pivot isn't too small. Shouldn't happen since
      // this is refactorization
      double abs_pivot = std::fabs(column.array[iRow]);
      assert(abs_pivot >= pivot_tolerance);
      if (abs_pivot < pivot_tolerance) {
        rank_deficiency = num_row - iK;
        return rank_deficiency;
      }
      const double pivot_multiplier = 1 / column.array[iRow];
      for (HighsInt section = 0; section < 2; section++) {
        HighsInt p0 = section == 0 ? start : pivot_k + 1;
        HighsInt p1 = section == 0 ? pivot_k : end;
        for (HighsInt k = p0; k < p1; k++) {
          HighsInt local_iRow = column.index[k];
          if (!has_pivot[local_iRow]) {
            l_index.push_back(local_iRow);
            l_value.push_back(column.array[local_iRow] * pivot_multiplier);
          } else {
            u_index.push_back(local_iRow);
            u_value.push_back(column.array[local_iRow]);
          }
        }
      }
      l_start[iK + 1] = l_index.size();
      u_pivot_index.push_back(iRow);
      u_pivot_value.push_back(column.array[iRow]);
      u_start.push_back(u_index.size());
      basic_index[iRow] = iVar;
      has_pivot[iRow] = true;
      if (report_lu) {
        printf("\nAfter Markowitz %d\n", (int)(iK - stage));
        reportLu(kReportLuBoth, false);
      }
    }
  }
  if (report_lu) {
    printf("\nRefactored INVERT\n");
    reportLu(kReportLuBoth, false);
  }
  buildFinish();
  return 0;
}